

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void __thiscall Fossilize::ScratchAllocator::reset(ScratchAllocator *this)

{
  Impl *this_00;
  const_iterator __last;
  size_t sVar1;
  pointer pBVar2;
  
  sVar1 = get_peak_memory_consumption(this);
  this_00 = this->impl;
  if (this_00->peak_history_size < sVar1) {
    this_00->peak_history_size = sVar1;
  }
  pBVar2 = (this_00->blocks).
           super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this_00->blocks).
       super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__last._M_current != pBVar2) {
    if (0x20 < (ulong)((long)__last._M_current - (long)pBVar2)) {
      std::
      vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
      ::erase(&this_00->blocks,pBVar2 + 1,__last);
      pBVar2 = (this->impl->blocks).
               super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    pBVar2->offset = 0;
  }
  return;
}

Assistant:

void ScratchAllocator::reset()
{
	// Keep track of how large the buffer can grow.
	size_t peak = get_peak_memory_consumption();
	if (peak > impl->peak_history_size)
		impl->peak_history_size = peak;

	if (impl->blocks.size() > 0)
	{
		// free all but first block
		if (impl->blocks.size() > 1)
			impl->blocks.erase(impl->blocks.begin() + 1, impl->blocks.end());
		// reset offset on first block
		impl->blocks[0].offset = 0;
	}
}